

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# record.cpp
# Opt level: O2

void recordingStartSecs(float _start,float _end,float _fps)

{
  fdelta = 1.0 / _fps;
  counter = 0;
  sec_start = _start;
  sec_head = _start;
  sec_end = _end;
  sec = true;
  return;
}

Assistant:

void recordingStartSecs(float _start, float _end, float _fps) {
    fdelta = 1.0/_fps;
    counter = 0;

    sec_start = _start;
    sec_head = _start;
    sec_end = _end;
    sec = true;
}